

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateSpaceFilter.cpp
# Opt level: O1

double __thiscall
rtb::Filter::StateSpaceFilter<double>::filter
          (StateSpaceFilter<double> *this,double value,double time,double f0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (this->lastTime_ <= time) {
    dVar4 = time - this->lastTime_;
    dVar5 = f0 * 6.283185307179586 * f0 * 6.283185307179586;
    dVar3 = f0 * 8.885765876316732 * (dVar4 + dVar4);
    dVar6 = dVar3 + 4.0;
    dVar7 = dVar4 * dVar4 * dVar5 + dVar6;
    dVar8 = -(dVar4 * dVar4) * dVar5;
    dVar1 = this->lastValue_;
    dVar2 = this->lastFirstDerivative_;
    dVar3 = (value + dVar1) * ((dVar5 * dVar4 * 4.0) / dVar7) * 0.5 +
            ((dVar4 * -4.0 * dVar5) / dVar7) * dVar1 + (((4.0 - dVar3) + dVar8) / dVar7) * dVar2;
    this->lastSecondDerivative_ = (dVar3 - dVar2) / dVar4;
    this->lastValue_ =
         (((dVar4 + dVar4) * dVar4 * dVar5) / dVar7) * (value + dVar1) * 0.5 +
         ((dVar6 + dVar8) / dVar7) * dVar1 + ((dVar4 * 4.0) / dVar7) * dVar2;
    this->lastFirstDerivative_ = dVar3;
  }
  else {
    this->lastValue_ = value;
    this->lastFirstDerivative_ = 0.0;
    this->lastSecondDerivative_ = 0.0;
  }
  this->lastTime_ = time;
  return this->lastValue_;
}

Assistant:

T StateSpaceFilter<T>::filter(T value, double time, double f0) {

            if (time < lastTime_)
            {
                lastValue_ = value;
                lastFirstDerivative_ = 0.0;
                lastSecondDerivative_ = 0.0;
            }
            else
            {
                double h = time - lastTime_;
                double a = (2 * M_PI * f0) * (2 * M_PI * f0);
                double b = sqrt(2) * 2 * M_PI * f0;
                double denom = 4 + 2 * h * b + h * h * a;
                double A = (4 + 2 * h*b - h * h * a) / denom;
                double B = 4 * h / denom;
                double C = -4 * h*a / denom;
                double D = (4 - 2 * h * b - h * h * a) / denom;
                double E = 2 * h * h * a / denom;
                double F = 4 * h*a / denom;
                double y = A*lastValue_ + B*lastFirstDerivative_ + E*(value + lastValue_) / 2;
                double yd = C*lastValue_ + D*lastFirstDerivative_ + F*(value + lastValue_) / 2;
                lastSecondDerivative_ = (yd - lastFirstDerivative_) / h;

                lastValue_ = y;
                lastFirstDerivative_ = yd;
            }
            lastTime_ = time;
            return lastValue_;
        }